

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

wchar_t hatch_last_embryo(parser *p)

{
  wchar_t wVar1;
  embryonic_ui_entry *embryo_00;
  wchar_t local_1c;
  wchar_t result;
  embryonic_ui_entry *embryo;
  parser *p_local;
  
  embryo_00 = (embryonic_ui_entry *)parser_priv(p);
  local_1c = L'\0';
  if (embryo_00 != (embryonic_ui_entry *)0x0) {
    wVar1 = hatch_embryo(embryo_00);
    local_1c = (wchar_t)(wVar1 != L'\0');
    mem_free(embryo_00);
    parser_setpriv(p,(void *)0x0);
  }
  return local_1c;
}

Assistant:

static int hatch_last_embryo(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	int result = 0;

	if (embryo) {
		if (hatch_embryo(embryo)) {
			result = 1;
		}
		mem_free(embryo);
		parser_setpriv(p, NULL);
	}
	return result;
}